

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_buffer_send
                   (Curl_send_buffer **inp,connectdata *conn,long *bytes_written,
                   size_t included_body_bytes,int socketindex)

{
  curl_socket_t sockfd;
  Curl_easy *data;
  void *pvVar1;
  Curl_send_buffer *pCVar2;
  ulong uVar3;
  ulong uVar4;
  CURLcode CVar5;
  char *pcVar6;
  Curl_send_buffer *in;
  size_t sVar7;
  ulong uVar8;
  size_t size;
  ulong size_00;
  ssize_t amount;
  ulong local_48;
  void *local_40;
  long *local_38;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  pCVar2 = *inp;
  sockfd = conn->sock[socketindex];
  pcVar6 = pCVar2->buffer;
  uVar3 = pCVar2->size_used;
  sVar7 = uVar3;
  local_38 = bytes_written;
  if ((((conn->handler->flags & 1) != 0) || ((conn->http_proxy).proxytype == CURLPROXY_HTTPS)) &&
     (conn->httpversion != 0x14)) {
    CVar5 = Curl_get_upload_buffer(data);
    if (CVar5 != CURLE_OK) goto LAB_00429ebc;
    sVar7 = 0x4000;
    if (uVar3 < 0x4000) {
      sVar7 = uVar3;
    }
    memcpy((data->state).ulbuf,pcVar6,sVar7);
    pcVar6 = (data->state).ulbuf;
  }
  CVar5 = Curl_write(conn,sockfd,pcVar6,sVar7,(ssize_t *)&local_48);
  uVar4 = local_48;
  if (CVar5 == CURLE_OK) {
    uVar8 = uVar3 - included_body_bytes;
    size_00 = uVar8;
    if (local_48 < uVar8) {
      size_00 = local_48;
    }
    size = local_48 - size_00;
    local_40 = pvVar1;
    if (((data->set).verbose == true) &&
       (Curl_debug(data,CURLINFO_HEADER_OUT,pcVar6,size_00), uVar8 < uVar4)) {
      Curl_debug(data,CURLINFO_DATA_OUT,pcVar6 + size_00,size);
    }
    *local_38 = *local_38 + local_48;
    if (local_40 == (void *)0x0) {
      if (uVar3 != local_48) {
        return CURLE_SEND_ERROR;
      }
      Curl_pipeline_leave_write(conn);
    }
    else {
      *(long *)((long)local_40 + 0x30) = *(long *)((long)local_40 + 0x30) + size;
      if (uVar3 - local_48 != 0) {
        pcVar6 = pCVar2->buffer;
        pvVar1 = (data->state).in;
        *(curl_read_callback *)((long)local_40 + 0x1f8) = (data->state).fread_func;
        *(void **)((long)local_40 + 0x200) = pvVar1;
        *(undefined8 *)((long)local_40 + 0x208) = *(undefined8 *)((long)local_40 + 0x10);
        *(undefined8 *)((long)local_40 + 0x210) = *(undefined8 *)((long)local_40 + 8);
        (data->state).fread_func = readmoredata;
        (data->state).in = conn;
        *(char **)((long)local_40 + 0x10) = pcVar6 + local_48;
        *(ulong *)((long)local_40 + 8) = uVar3 - local_48;
        *(Curl_send_buffer **)((long)local_40 + 0x220) = pCVar2;
        *(undefined4 *)((long)local_40 + 0x218) = 1;
        return CURLE_OK;
      }
      *(undefined4 *)((long)local_40 + 0x218) = 2;
    }
  }
LAB_00429ebc:
  (*Curl_cfree)(pCVar2->buffer);
  (*Curl_cfree)(pCVar2);
  return CVar5;
}

Assistant:

CURLcode Curl_add_buffer_send(Curl_send_buffer **inp,
                              struct connectdata *conn,

                               /* add the number of sent bytes to this
                                  counter */
                              long *bytes_written,

                               /* how much of the buffer contains body data */
                              size_t included_body_bytes,
                              int socketindex)

{
  ssize_t amount;
  CURLcode result;
  char *ptr;
  size_t size;
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;
  size_t sendsize;
  curl_socket_t sockfd;
  size_t headersize;
  Curl_send_buffer *in = *inp;

  DEBUGASSERT(socketindex <= SECONDARYSOCKET);

  sockfd = conn->sock[socketindex];

  /* The looping below is required since we use non-blocking sockets, but due
     to the circumstances we will just loop and try again and again etc */

  ptr = in->buffer;
  size = in->size_used;

  headersize = size - included_body_bytes; /* the initial part that isn't body
                                              is header */

  DEBUGASSERT(size > included_body_bytes);

  result = Curl_convert_to_network(data, ptr, headersize);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result) {
    /* conversion failed, free memory and return to the caller */
    Curl_add_buffer_free(inp);
    return result;
  }

  if((conn->handler->flags & PROTOPT_SSL ||
     conn->http_proxy.proxytype == CURLPROXY_HTTPS)
     && conn->httpversion != 20) {
    /* We never send more than CURL_MAX_WRITE_SIZE bytes in one single chunk
       when we speak HTTPS, as if only a fraction of it is sent now, this data
       needs to fit into the normal read-callback buffer later on and that
       buffer is using this size.
    */

    sendsize = CURLMIN(size, CURL_MAX_WRITE_SIZE);

    /* OpenSSL is very picky and we must send the SAME buffer pointer to the
       library when we attempt to re-send this buffer. Sending the same data
       is not enough, we must use the exact same address. For this reason, we
       must copy the data to the uploadbuffer first, since that is the buffer
       we will be using if this send is retried later.
    */
    result = Curl_get_upload_buffer(data);
    if(result) {
      /* malloc failed, free memory and return to the caller */
      Curl_add_buffer_free(&in);
      return result;
    }
    memcpy(data->state.ulbuf, ptr, sendsize);
    ptr = data->state.ulbuf;
  }
  else
    sendsize = size;

  result = Curl_write(conn, sockfd, ptr, sendsize, &amount);

  if(!result) {
    /*
     * Note that we may not send the entire chunk at once, and we have a set
     * number of data bytes at the end of the big buffer (out of which we may
     * only send away a part).
     */
    /* how much of the header that was sent */
    size_t headlen = (size_t)amount>headersize ? headersize : (size_t)amount;
    size_t bodylen = amount - headlen;

    if(data->set.verbose) {
      /* this data _may_ contain binary stuff */
      Curl_debug(data, CURLINFO_HEADER_OUT, ptr, headlen);
      if(bodylen) {
        /* there was body data sent beyond the initial header part, pass that
           on to the debug callback too */
        Curl_debug(data, CURLINFO_DATA_OUT,
                   ptr + headlen, bodylen);
      }
    }

    /* 'amount' can never be a very large value here so typecasting it so a
       signed 31 bit value should not cause problems even if ssize_t is
       64bit */
    *bytes_written += (long)amount;

    if(http) {
      /* if we sent a piece of the body here, up the byte counter for it
         accordingly */
      http->writebytecount += bodylen;

      if((size_t)amount != size) {
        /* The whole request could not be sent in one system call. We must
           queue it up and send it later when we get the chance. We must not
           loop here and wait until it might work again. */

        size -= amount;

        ptr = in->buffer + amount;

        /* backup the currently set pointers */
        http->backup.fread_func = data->state.fread_func;
        http->backup.fread_in = data->state.in;
        http->backup.postdata = http->postdata;
        http->backup.postsize = http->postsize;

        /* set the new pointers for the request-sending */
        data->state.fread_func = (curl_read_callback)readmoredata;
        data->state.in = (void *)conn;
        http->postdata = ptr;
        http->postsize = (curl_off_t)size;

        http->send_buffer = in;
        http->sending = HTTPSEND_REQUEST;

        return CURLE_OK;
      }
      http->sending = HTTPSEND_BODY;
      /* the full buffer was sent, clean up and return */
    }
    else {
      if((size_t)amount != size)
        /* We have no continue-send mechanism now, fail. This can only happen
           when this function is used from the CONNECT sending function. We
           currently (stupidly) assume that the whole request is always sent
           away in the first single chunk.

           This needs FIXing.
        */
        return CURLE_SEND_ERROR;
      Curl_pipeline_leave_write(conn);
    }
  }
  Curl_add_buffer_free(&in);

  return result;
}